

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int32_t helicsDataBufferFillFromDouble(HelicsDataBuffer data,double value)

{
  SmallBuffer *this;
  size_t sVar1;
  bad_alloc *anon_var_0;
  SmallBuffer *ptr;
  SmallBuffer *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  HelicsDataBuffer in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  this = getBuffer(in_stack_ffffffffffffffc8);
  if (this == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    helics::ValueConverter<double>::convert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar1 = helics::SmallBuffer::size(this);
    local_4 = (int32_t)sVar1;
  }
  return local_4;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromDouble(HelicsDataBuffer data, double value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<double>::convert(value, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}